

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_get_person(void)

{
  uint uVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  exception *e;
  type result;
  bool r;
  rpc_client client;
  string *in_stack_fffffffffffffb60;
  rpc_client *this;
  rpc_client *in_stack_fffffffffffffb90;
  string local_468 [30];
  unsigned_short in_stack_fffffffffffffbb6;
  string *in_stack_fffffffffffffbb8;
  rpc_client *in_stack_fffffffffffffbc0;
  allocator local_3f9;
  string local_3f8 [32];
  rpc_client local_3d8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"127.0.0.1",&local_3f9);
  rest_rpc::rpc_client::rpc_client
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb6);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  uVar1 = rest_rpc::rpc_client::connect(&local_3d8,3,(sockaddr *)0x0,in_ECX);
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    this = (rpc_client *)&stack0xfffffffffffffb97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,"get_person",(allocator *)this);
    rest_rpc::rpc_client::call<person>(this,in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb97);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffbc0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    person::~person((person *)0x1ace27);
  }
  rest_rpc::rpc_client::~rpc_client(in_stack_fffffffffffffb90);
  return;
}

Assistant:

void test_get_person() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result = client.call<person>("get_person");
    std::cout << result.name << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}